

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  int size;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar1;
  
  if (cur != (xmlChar *)0x0) {
    xmlInitParser();
    size = xmlStrlen(cur);
    ctxt = xmlCreateMemoryParserCtxt((char *)cur,size);
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      pxVar1 = xmlDoRead(ctxt,URL,encoding,options,0);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlReadDoc(const xmlChar * cur, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return (NULL);
    xmlInitParser();

    ctxt = xmlCreateDocParserCtxt(cur);
    if (ctxt == NULL)
        return (NULL);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}